

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphBase.h
# Opt level: O2

double GraphBase::inf_eval(Graph *graph,
                          vector<unsigned_long,_std::allocator<unsigned_long>_> *vecSeed,
                          CascadeModel model,uint32_t evalsize)

{
  uint uVar1;
  pointer puVar2;
  pointer pvVar3;
  pointer ppVar4;
  size_t __nmemb;
  void *__ptr;
  void *__ptr_00;
  pointer puVar5;
  ostream *poVar6;
  ulong uVar7;
  pointer puVar8;
  uint32_t uVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  pair<unsigned_int,_float> *nbr;
  pointer ppVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  allocator_type local_139;
  double local_138;
  uint32_t local_130;
  CascadeModel local_12c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vecActivated;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range1;
  value_type_conflict4 local_f0;
  double local_e8;
  double dStack_e0;
  double local_d8;
  vector<double,_std::allocator<double>_> vecActivateWeight;
  vector<double,_std::allocator<double>_> vecThr;
  Timer local_a0;
  queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> Que;
  
  local_12c = model;
  local_a0.__StartTime.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_a0.__processName = "Unnamed";
  local_a0.__LastTime.__d.__r = local_a0.__StartTime.__d.__r;
  local_a0.__EndTime.__d.__r = local_a0.__StartTime.__d.__r;
  std::queue<unsigned_int,std::deque<unsigned_int,std::allocator<unsigned_int>>>::
  queue<std::deque<unsigned_int,std::allocator<unsigned_int>>,void>(&Que);
  vecActivated.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vecActivated.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vecActivated.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  __nmemb = ((long)(graph->
                   super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
            (long)(graph->
                  super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start) / 0x18;
  lVar10 = (long)(vecSeed->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(vecSeed->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start;
  __ptr = calloc(__nmemb,1);
  __ptr_00 = calloc(__nmemb,4);
  std::vector<double,_std::allocator<double>_>::vector
            (&vecThr,__nmemb,(allocator_type *)&vecActivateWeight);
  local_f0 = 0.0;
  std::vector<double,_std::allocator<double>_>::vector
            (&vecActivateWeight,__nmemb,&local_f0,&local_139);
  lVar11 = lVar10 >> 3;
  auVar15._8_4_ = (int)(lVar10 >> 0x23);
  auVar15._0_8_ = lVar11;
  auVar15._12_4_ = 0x45300000;
  dStack_e0 = auVar15._8_8_ - 1.9342813113834067e+25;
  local_e8 = dStack_e0 + ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0);
  puVar2 = (vecSeed->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar5 = (vecSeed->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                .super__Vector_impl_data._M_start; puVar5 != puVar2; puVar5 = puVar5 + 1) {
    *(undefined1 *)((long)__ptr + *puVar5) = 1;
  }
  local_d8 = (double)evalsize;
  iVar12 = 0;
  local_130 = evalsize;
  for (uVar9 = 0; uVar9 != local_130; uVar9 = uVar9 + 1) {
    if (uVar9 * 100 < iVar12 * local_130) {
      local_138 = (double)CONCAT44(local_138._4_4_,iVar12);
    }
    else {
      local_138 = Timer::get_operation_time(&local_a0);
      if (100.0 < local_138) {
        poVar6 = std::operator<<((ostream *)&std::cout,"\tMC-Progress at: ");
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        poVar6 = std::operator<<(poVar6,"%, ");
        std::operator<<(poVar6,"time used: ");
        poVar6 = std::ostream::_M_insert<double>(local_138);
        std::endl<char,std::char_traits<char>>(poVar6);
      }
      local_138 = (double)CONCAT44(local_138._4_4_,iVar12 + 0x14);
    }
    puVar2 = (vecSeed->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (puVar5 = (vecSeed->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_start; puVar5 != puVar2; puVar5 = puVar5 + 1) {
      local_f0 = (value_type_conflict4)CONCAT44(local_f0._4_4_,(int)*puVar5);
      std::deque<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                (&Que.c,(uint *)&local_f0);
    }
    if (local_12c == LT) {
      while( true ) {
        if (Que.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur ==
            Que.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur) break;
        uVar1 = *Que.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Deque_impl_data._M_start._M_cur;
        std::deque<unsigned_int,_std::allocator<unsigned_int>_>::pop_front(&Que.c);
        pvVar3 = (graph->
                 super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        ppVar4 = *(pointer *)
                  ((long)&pvVar3[uVar1].
                          super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                          ._M_impl.super__Vector_impl_data + 8);
        for (ppVar13 = pvVar3[uVar1].
                       super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; ppVar13 != ppVar4;
            ppVar13 = ppVar13 + 1) {
          uVar7 = (ulong)ppVar13->first;
          if (*(char *)((long)__ptr + uVar7) == '\0') {
            if (*(uint *)((long)__ptr_00 + uVar7 * 4) < uVar9 + 1) {
              *(uint32_t *)((long)__ptr_00 + uVar7 * 4) = uVar9 + 1;
              if (0x17d < dsfmt_global_data.idx) {
                dsfmt_gen_rand_all(&dsfmt_global_data);
                uVar7 = (ulong)ppVar13->first;
                dsfmt_global_data.idx = 0;
              }
              lVar10 = (long)dsfmt_global_data.idx;
              dsfmt_global_data.idx = dsfmt_global_data.idx + 1;
              vecThr.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar7] = 2.0 - dsfmt_global_data.status[0].d[lVar10];
              vecActivateWeight.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar7] = 0.0;
              dVar14 = 0.0;
            }
            else {
              dVar14 = vecActivateWeight.super__Vector_base<double,_std::allocator<double>_>._M_impl
                       .super__Vector_impl_data._M_start[uVar7];
            }
            dVar14 = (double)ppVar13->second + dVar14;
            vecActivateWeight.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar7] = dVar14;
            if (vecThr.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar7] <= dVar14) {
              *(undefined1 *)((long)__ptr + uVar7) = 1;
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                        (&vecActivated,&ppVar13->first);
              std::deque<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                        (&Que.c,&ppVar13->first);
            }
          }
        }
      }
    }
    else if (local_12c == IC) {
      while (Que.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur !=
             Que.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur) {
        uVar1 = *Que.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Deque_impl_data._M_start._M_cur;
        std::deque<unsigned_int,_std::allocator<unsigned_int>_>::pop_front(&Que.c);
        pvVar3 = (graph->
                 super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        ppVar4 = *(pointer *)
                  ((long)&pvVar3[uVar1].
                          super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                          ._M_impl.super__Vector_impl_data + 8);
        for (ppVar13 = pvVar3[uVar1].
                       super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; ppVar13 != ppVar4;
            ppVar13 = ppVar13 + 1) {
          if (*(char *)((long)__ptr + (ulong)ppVar13->first) == '\0') {
            if (0x17d < dsfmt_global_data.idx) {
              dsfmt_gen_rand_all(&dsfmt_global_data);
              dsfmt_global_data.idx = 0;
            }
            iVar12 = dsfmt_global_data.idx + 1;
            lVar10 = (long)dsfmt_global_data.idx;
            dsfmt_global_data.idx = iVar12;
            if (2.0 - dsfmt_global_data.status[0].d[lVar10] <= (double)ppVar13->second) {
              *(undefined1 *)((long)__ptr + (ulong)ppVar13->first) = 1;
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                        (&vecActivated,&ppVar13->first);
              std::deque<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                        (&Que.c,&ppVar13->first);
            }
          }
        }
      }
    }
    lVar10 = (long)vecActivated.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)vecActivated.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 2;
    auVar16._8_4_ =
         (int)((long)vecActivated.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)vecActivated.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 0x22);
    auVar16._0_8_ = lVar10;
    auVar16._12_4_ = 0x45300000;
    for (puVar8 = vecActivated.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        puVar8 != vecActivated.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_finish; puVar8 = puVar8 + 1) {
      *(undefined1 *)((long)__ptr + (ulong)*puVar8) = 0;
    }
    if (vecActivated.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        vecActivated.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start) {
      vecActivated.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           vecActivated.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
    local_e8 = local_e8 +
               ((auVar16._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar10) - 4503599627370496.0)) / local_d8;
    iVar12 = local_138._0_4_;
  }
  free(__ptr);
  free(__ptr_00);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&vecActivateWeight.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&vecThr.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&vecActivated.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Deque_base
            ((_Deque_base<unsigned_int,_std::allocator<unsigned_int>_> *)&Que);
  return local_e8;
}

Assistant:

static double inf_eval(const Graph& graph, const std::vector<size_t>& vecSeed, const CascadeModel model,
                           const uint32_t evalsize = 10000)
    {
        Timer EvalTimer;
//        std::cout << "  >>>Evaluate influence...\n";
        uint32_t nodeId, currProgress = 0;
        std::queue<uint32_t> Que;
        std::vector<uint32_t> vecActivated;

        const auto numV = graph.size();
        auto inf = (double)vecSeed.size();
        bool* activated = (bool *)calloc(numV, sizeof(bool));
        auto* visited = (uint32_t *)calloc(numV, sizeof(uint32_t));
        std::vector<double> vecThr(numV);
        std::vector<double> vecActivateWeight(numV, 0.0);
        for (auto seedId : vecSeed) activated[seedId] = true;
        for (uint32_t i = 0; i < evalsize; i++)
        {
            if (i * 100 >= evalsize * currProgress)
            {
                const auto evalTime = EvalTimer.get_operation_time();
                if (evalTime > 100)
                    std::cout << "\tMC-Progress at: " << currProgress << "%, " <<
                    "time used: " << evalTime << std::endl;
                currProgress += 20;
            }
            for (auto seed : vecSeed)
            {
                Que.push(seed);
            }

            // BFS traversal
            if (model == IC)
            {
                while (!Que.empty())
                {
                    nodeId = Que.front();
                    Que.pop();
                    for (auto& nbr : graph[nodeId])
                    {
                        if (activated[nbr.first]) continue;
                        if (dsfmt_gv_genrand_open_close() <= nbr.second)
                        {
                            activated[nbr.first] = true;
                            vecActivated.push_back(nbr.first);
                            Que.push(nbr.first);
                        }
                    }
                }
            }
            else if (model == LT)
            {
                while (!Que.empty())
                {
                    nodeId = Que.front();
                    Que.pop();
                    for (auto& nbr : graph[nodeId])
                    {
                        if (activated[nbr.first]) continue;
                        if (visited[nbr.first] < i + 1)
                        {
                            // First time visit this node
                            visited[nbr.first] = i + 1;
                            vecThr[nbr.first] = dsfmt_gv_genrand_open_close();
                            vecActivateWeight[nbr.first] = 0.0;
                        }
                        vecActivateWeight[nbr.first] += nbr.second;
                        if (vecActivateWeight[nbr.first] >= vecThr[nbr.first])
                        {
                            // Activation weight is greater than threshold
                            activated[nbr.first] = true;
                            vecActivated.push_back(nbr.first);
                            Que.push(nbr.first);
                        }
                    }
                }
            }
            inf += (double)vecActivated.size() / evalsize;
            for (auto activatedNode : vecActivated) activated[activatedNode] = false;
            vecActivated.clear();
        }
        free(activated);
        free(visited);
//        std::cout << "  >>>MC-Influence spread: " << inf << ", time used (sec): " <<
//        EvalTimer.get_total_time() << std::endl;
        return inf;
    }